

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cc
# Opt level: O1

void __thiscall t_server::~t_server(t_server *this)

{
  pointer pptVar1;
  t_client *a_client;
  pointer pptVar2;
  
  pptVar2 = (this->v_clients).super__Vector_base<t_client_*,_std::allocator<t_client_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while (pptVar1 = (this->v_clients).super__Vector_base<t_client_*,_std::allocator<t_client_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish, pptVar2 != pptVar1) {
    a_client = pptVar1[-1];
    if (a_client->v_server != (t_server *)0x0) {
      f_remove(a_client->v_server,a_client);
      a_client->v_server = (t_server *)0x0;
    }
    pptVar2 = (this->v_clients).super__Vector_base<t_client_*,_std::allocator<t_client_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (pptVar2 != (pointer)0x0) {
    operator_delete(pptVar2,(long)(this->v_clients).
                                  super__Vector_base<t_client_*,_std::allocator<t_client_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pptVar2)
    ;
    return;
  }
  return;
}

Assistant:

t_server::~t_server()
{
	while (!v_clients.empty()) v_clients.back()->f_remove();
}